

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CImg.h
# Opt level: O1

CImg<unsigned_int> * __thiscall
cimg_library::CImg<unsigned_int>::get_index<unsigned_char>
          (CImg<unsigned_int> *__return_storage_ptr__,CImg<unsigned_int> *this,
          CImg<unsigned_char> *colormap,float dithering,bool map_indexes)

{
  uint *puVar1;
  byte bVar2;
  uint uVar3;
  uint uVar4;
  byte *pbVar5;
  int iVar6;
  uint *puVar7;
  uint *puVar8;
  uint *puVar9;
  ulong uVar10;
  float *pfVar11;
  CImgArgumentException *this_00;
  long lVar12;
  ulong uVar13;
  uint *puVar14;
  float *pfVar15;
  byte *pbVar16;
  long lVar17;
  uint *puVar18;
  float *pfVar19;
  uint uVar20;
  uint uVar21;
  uint *puVar22;
  float *pfVar23;
  float *pfVar24;
  float *pfVar25;
  float *pfVar26;
  byte *pbVar27;
  uint size_c;
  uchar *ptrp_end;
  long lVar28;
  byte *pbVar29;
  int iVar30;
  uchar *ptrp_end_1;
  uint *puVar31;
  char *pcVar32;
  int iVar33;
  long lVar34;
  long lVar35;
  uint *puVar36;
  long lVar37;
  float fVar38;
  float fVar39;
  float fVar40;
  float fVar41;
  float fVar42;
  float fVar43;
  float fVar44;
  long local_110;
  float *local_108;
  uint *local_f8;
  long local_f0;
  Tfloat valm;
  float *local_e0;
  CImg<unsigned_char> *local_d8;
  CImg<unsigned_int> *local_d0;
  float *local_c8;
  float *local_c0;
  long local_b8;
  uint *local_b0;
  long local_a8;
  float *local_a0;
  long local_98;
  long local_90;
  uint *local_88;
  uint *local_80;
  uint *local_78;
  CImg<unsigned_int> local_70;
  CImg<float> cache;
  
  uVar20 = this->_spectrum;
  local_d8 = colormap;
  local_d0 = __return_storage_ptr__;
  if (colormap->_spectrum != uVar20) {
    this_00 = (CImgArgumentException *)__cxa_allocate_exception(0x4008);
    pcVar32 = "non-";
    if (this->_is_shared != false) {
      pcVar32 = "";
    }
    CImgArgumentException::CImgArgumentException
              (this_00,
               "[instance(%u,%u,%u,%u,%p,%sshared)] CImg<%s>::index(): Instance and specified colormap (%u,%u,%u,%u,%p) have incompatible dimensions."
               ,(ulong)this->_width,(ulong)this->_height,(ulong)this->_depth,(ulong)this->_spectrum,
               this->_data,pcVar32,"unsigned int",(ulong)local_d8->_width,(ulong)local_d8->_height,
               (ulong)local_d8->_depth,(ulong)local_d8->_spectrum,local_d8->_data);
    __cxa_throw(this_00,&CImgArgumentException::typeinfo,std::exception::~exception);
  }
  if ((uVar20 != 0) && (this->_data != (uint *)0x0)) {
    uVar21 = this->_width;
    if (uVar21 != 0) {
      uVar3 = this->_height;
      if (uVar3 != 0) {
        uVar4 = this->_depth;
        if (uVar4 != 0) {
          lVar37 = (ulong)uVar3 * (ulong)uVar21 * (ulong)uVar4;
          lVar35 = (ulong)colormap->_depth * (ulong)colormap->_height * (ulong)colormap->_width;
          size_c = 1;
          if (map_indexes) {
            size_c = uVar20;
          }
          CImg(__return_storage_ptr__,uVar21,uVar3,uVar4,size_c);
          puVar36 = __return_storage_ptr__->_data;
          if (0.0 < dithering) {
            valm = 0.0;
            puVar7 = max_min<float>(this,&valm);
            fVar38 = (float)*puVar7;
            if (((*puVar7 < 0x100) && (valm == fVar38)) && (0.0 <= valm)) {
              valm = 0.0;
              fVar38 = 255.0;
            }
            get_crop(&local_70,this,-1,0,0,0,this->_width,1,0,this->_spectrum - 1,false);
            CImg<float>::CImg<unsigned_int>(&cache,&local_70);
            fVar44 = 1.0;
            if (dithering <= 1.0) {
              fVar44 = dithering;
            }
            if ((local_70._is_shared == false) && (local_70._data != (uint *)0x0)) {
              operator_delete__(local_70._data);
            }
            fVar44 = fVar44 * 0.0625;
            local_108 = cache._data + 1;
            local_a0 = cache._data;
            pfVar11 = cache._data + (ulong)cache._width + 1;
            lVar12 = (ulong)cache._height * (ulong)cache._width * (ulong)cache._depth;
            uVar20 = this->_depth;
            uVar21 = this->_spectrum;
            if (uVar21 == 3) {
              if (0 < (int)uVar20) {
                local_e0 = (float *)(puVar36 + lVar37);
                local_c8 = local_e0 + lVar37;
                local_98 = lVar37 * 4;
                local_b8 = 0;
                lVar17 = 0;
                do {
                  local_90 = lVar17;
                  uVar20 = this->_height;
                  pfVar23 = local_108;
                  if (0 < (int)uVar20) {
                    local_78 = this->_data;
                    pbVar5 = local_d8->_data;
                    local_80 = local_78 + lVar37;
                    local_88 = local_78 + lVar37 * 2;
                    iVar30 = 0;
                    local_b0 = (uint *)CONCAT44(local_b0._4_4_,1);
                    do {
                      pfVar23 = pfVar11;
                      local_a8 = CONCAT44(local_a8._4_4_,iVar30);
                      if (iVar30 < (int)(uVar20 - 2)) {
                        uVar21 = this->_width;
                        if (0 < (long)(int)uVar21) {
                          lVar17 = (ulong)uVar20 * local_b8 * (long)(int)uVar21 +
                                   (ulong)(uVar21 * (int)local_b0) * 4;
                          lVar28 = 0;
                          do {
                            pfVar23[lVar28] = (float)*(uint *)((long)local_78 + lVar28 * 4 + lVar17)
                            ;
                            pfVar23[lVar12 + lVar28] =
                                 (float)*(uint *)((long)local_80 + lVar28 * 4 + lVar17);
                            pfVar23[lVar12 * 2 + lVar28] =
                                 (float)*(uint *)((long)local_88 + lVar28 * 4 + lVar17);
                            lVar28 = lVar28 + 1;
                          } while (uVar21 != (uint)lVar28);
                        }
                      }
                      if (0 < (int)this->_width) {
                        pfVar11 = pfVar23 + lVar12;
                        pfVar19 = pfVar11 + lVar12;
                        pfVar24 = local_108 + lVar12;
                        pfVar26 = pfVar24 + lVar12;
                        iVar33 = 0;
                        pfVar15 = pfVar23;
                        pfVar25 = local_108;
                        do {
                          fVar39 = *pfVar25;
                          fVar40 = fVar38;
                          if (fVar39 <= fVar38) {
                            fVar40 = fVar39;
                          }
                          fVar41 = (float)(-(uint)(fVar39 < valm) & (uint)valm |
                                          ~-(uint)(fVar39 < valm) & (uint)fVar40);
                          fVar39 = *pfVar24;
                          fVar40 = fVar38;
                          if (fVar39 <= fVar38) {
                            fVar40 = fVar39;
                          }
                          fVar40 = (float)(-(uint)(fVar39 < valm) & (uint)valm |
                                          ~-(uint)(fVar39 < valm) & (uint)fVar40);
                          fVar39 = *pfVar26;
                          fVar42 = fVar38;
                          if (fVar39 <= fVar38) {
                            fVar42 = fVar39;
                          }
                          fVar39 = (float)(-(uint)(fVar39 < valm) & (uint)valm |
                                          ~-(uint)(fVar39 < valm) & (uint)fVar42);
                          pbVar29 = pbVar5;
                          if (0 < lVar35) {
                            fVar42 = 3.4e+38;
                            pbVar27 = pbVar5;
                            do {
                              fVar43 = ((float)pbVar27[lVar35 * 2] - fVar39) *
                                       ((float)pbVar27[lVar35 * 2] - fVar39) +
                                       ((float)*pbVar27 - fVar41) * ((float)*pbVar27 - fVar41) +
                                       ((float)pbVar27[lVar35] - fVar40) *
                                       ((float)pbVar27[lVar35] - fVar40);
                              if (fVar43 < fVar42) {
                                pbVar29 = pbVar27;
                              }
                              pbVar27 = pbVar27 + 1;
                              if (fVar42 <= fVar43) {
                                fVar43 = fVar42;
                              }
                              fVar42 = fVar43;
                            } while (pbVar27 < pbVar5 + lVar35);
                          }
                          *pfVar25 = fVar41;
                          bVar2 = *pbVar29;
                          *pfVar24 = fVar40;
                          fVar41 = (fVar41 - (float)bVar2) * fVar44;
                          fVar40 = (fVar40 - (float)pbVar29[lVar35]) * fVar44;
                          *pfVar26 = fVar39;
                          fVar39 = (fVar39 - (float)pbVar29[lVar35 * 2]) * fVar44;
                          pfVar25[1] = fVar41 * 7.0 + pfVar25[1];
                          pfVar24[1] = fVar40 * 7.0 + pfVar24[1];
                          pfVar26[1] = fVar39 * 7.0 + pfVar26[1];
                          pfVar15[-1] = fVar41 * 3.0 + pfVar15[-1];
                          pfVar11[-1] = fVar40 * 3.0 + pfVar11[-1];
                          pfVar19[-1] = fVar39 * 3.0 + pfVar19[-1];
                          *pfVar15 = fVar41 * 5.0 + *pfVar15;
                          *pfVar11 = fVar40 * 5.0 + *pfVar11;
                          *pfVar19 = fVar39 * 5.0 + *pfVar19;
                          pfVar15[1] = fVar41 + pfVar15[1];
                          pfVar11[1] = fVar40 + pfVar11[1];
                          pfVar19[1] = fVar39 + pfVar19[1];
                          if (map_indexes) {
                            *puVar36 = (uint)*pbVar29;
                            *local_e0 = (float)(uint)pbVar29[lVar35];
                            local_e0 = local_e0 + 1;
                            *local_c8 = (float)(uint)pbVar29[lVar35 * 2];
                            local_c8 = local_c8 + 1;
                          }
                          else {
                            local_110._0_4_ = (int)pbVar5;
                            *puVar36 = (int)pbVar29 - (int)local_110;
                          }
                          pfVar25 = pfVar25 + 1;
                          pfVar24 = pfVar24 + 1;
                          pfVar26 = pfVar26 + 1;
                          pfVar15 = pfVar15 + 1;
                          pfVar11 = pfVar11 + 1;
                          pfVar19 = pfVar19 + 1;
                          puVar36 = puVar36 + 1;
                          iVar33 = iVar33 + 1;
                        } while (iVar33 < (int)this->_width);
                      }
                      iVar30 = iVar30 + 1;
                      uVar20 = this->_height;
                      local_b0 = (uint *)CONCAT44(local_b0._4_4_,(int)local_b0 + 1);
                      pfVar11 = local_108;
                      local_108 = pfVar23;
                      local_c0 = pfVar23;
                    } while (iVar30 < (int)uVar20);
                  }
                  local_b8 = local_b8 + 4;
                  lVar17 = local_90 + 1;
                  local_108 = pfVar23;
                } while (local_90 + 1 < (long)(int)this->_depth);
              }
            }
            else if (uVar21 == 2) {
              if (0 < (int)uVar20) {
                local_f8 = puVar36 + lVar37;
                local_c8 = (float *)0x0;
                do {
                  uVar20 = this->_height;
                  pfVar23 = local_108;
                  if (0 < (int)uVar20) {
                    local_c0 = (float *)this->_data;
                    pbVar5 = local_d8->_data;
                    pfVar19 = (float *)0x0;
                    do {
                      local_e0 = pfVar19;
                      pfVar23 = pfVar11;
                      iVar30 = (int)local_e0;
                      if (iVar30 < (int)(uVar20 - 2)) {
                        uVar10 = (ulong)(int)this->_width;
                        if (0 < (long)uVar10) {
                          pfVar11 = local_c0 +
                                    (ulong)((iVar30 + 1) * this->_width) +
                                    (ulong)uVar20 * (long)local_c8 * uVar10;
                          pfVar19 = pfVar23;
                          do {
                            *pfVar19 = (float)(uint)*pfVar11;
                            pfVar24 = pfVar11 + lVar37;
                            pfVar11 = pfVar11 + 1;
                            pfVar19[lVar12] = (float)(uint)*pfVar24;
                            pfVar19 = pfVar19 + 1;
                            uVar20 = (int)uVar10 - 1;
                            uVar10 = (ulong)uVar20;
                          } while (uVar20 != 0);
                        }
                      }
                      if (0 < (int)this->_width) {
                        pfVar11 = pfVar23 + lVar12;
                        pfVar19 = local_108 + lVar12;
                        iVar33 = 0;
                        pfVar24 = local_108;
                        pfVar26 = pfVar23;
                        do {
                          fVar39 = *pfVar24;
                          fVar40 = fVar38;
                          if (fVar39 <= fVar38) {
                            fVar40 = fVar39;
                          }
                          fVar40 = (float)(-(uint)(fVar39 < valm) & (uint)valm |
                                          ~-(uint)(fVar39 < valm) & (uint)fVar40);
                          fVar39 = *pfVar19;
                          fVar41 = fVar38;
                          if (fVar39 <= fVar38) {
                            fVar41 = fVar39;
                          }
                          fVar39 = (float)(-(uint)(fVar39 < valm) & (uint)valm |
                                          ~-(uint)(fVar39 < valm) & (uint)fVar41);
                          pbVar29 = pbVar5;
                          if (0 < lVar35) {
                            pbVar27 = pbVar5;
                            fVar41 = 3.4e+38;
                            do {
                              fVar42 = ((float)*pbVar27 - fVar40) * ((float)*pbVar27 - fVar40) +
                                       ((float)pbVar27[lVar35] - fVar39) *
                                       ((float)pbVar27[lVar35] - fVar39);
                              if (fVar42 < fVar41) {
                                pbVar29 = pbVar27;
                              }
                              pbVar27 = pbVar27 + 1;
                              if (fVar41 <= fVar42) {
                                fVar42 = fVar41;
                              }
                              fVar41 = fVar42;
                            } while (pbVar27 < pbVar5 + lVar35);
                          }
                          *pfVar24 = fVar40;
                          fVar40 = (fVar40 - (float)*pbVar29) * fVar44;
                          *pfVar19 = fVar39;
                          fVar39 = (fVar39 - (float)pbVar29[lVar35]) * fVar44;
                          pfVar24[1] = fVar40 * 7.0 + pfVar24[1];
                          pfVar19[1] = fVar39 * 7.0 + pfVar19[1];
                          pfVar26[-1] = fVar40 * 3.0 + pfVar26[-1];
                          pfVar11[-1] = fVar39 * 3.0 + pfVar11[-1];
                          *pfVar26 = fVar40 * 5.0 + *pfVar26;
                          *pfVar11 = fVar39 * 5.0 + *pfVar11;
                          pfVar26[1] = fVar40 + pfVar26[1];
                          pfVar11[1] = fVar39 + pfVar11[1];
                          if (map_indexes) {
                            *puVar36 = (uint)*pbVar29;
                            *local_f8 = (uint)pbVar29[lVar35];
                            local_f8 = local_f8 + 1;
                          }
                          else {
                            *puVar36 = (int)pbVar29 - (int)pbVar5;
                          }
                          pfVar24 = pfVar24 + 1;
                          pfVar19 = pfVar19 + 1;
                          pfVar26 = pfVar26 + 1;
                          pfVar11 = pfVar11 + 1;
                          puVar36 = puVar36 + 1;
                          iVar33 = iVar33 + 1;
                        } while (iVar33 < (int)this->_width);
                      }
                      uVar20 = this->_height;
                      pfVar11 = local_108;
                      pfVar19 = (float *)(ulong)(iVar30 + 1U);
                      local_108 = pfVar23;
                    } while ((int)(iVar30 + 1U) < (int)uVar20);
                  }
                  local_c8 = (float *)((long)local_c8 + 1);
                  local_108 = pfVar23;
                } while ((long)local_c8 < (long)(int)this->_depth);
              }
            }
            else if (uVar21 == 1) {
              if (0 < (int)uVar20) {
                lVar37 = 0;
                lVar12 = 0;
                do {
                  uVar20 = this->_height;
                  pfVar23 = local_108;
                  if (0 < (int)uVar20) {
                    puVar7 = this->_data;
                    pbVar5 = local_d8->_data;
                    iVar30 = 0;
                    iVar33 = 1;
                    do {
                      pfVar23 = pfVar11;
                      if (iVar30 < (int)(uVar20 - 2)) {
                        uVar21 = this->_width;
                        if (0 < (long)(int)uVar21) {
                          lVar17 = 0;
                          do {
                            pfVar23[lVar17] =
                                 (float)*(uint *)((long)puVar7 +
                                                 lVar17 * 4 +
                                                 (ulong)uVar20 * lVar37 * (long)(int)uVar21 +
                                                 (ulong)(uVar21 * iVar33) * 4);
                            lVar17 = lVar17 + 1;
                          } while (uVar21 != (uint)lVar17);
                        }
                      }
                      if (0 < (int)this->_width) {
                        iVar6 = 0;
                        pfVar11 = local_108;
                        pfVar19 = pfVar23;
                        do {
                          fVar39 = *pfVar11;
                          fVar40 = fVar38;
                          if (fVar39 <= fVar38) {
                            fVar40 = fVar39;
                          }
                          fVar39 = (float)(-(uint)(fVar39 < valm) & (uint)valm |
                                          ~-(uint)(fVar39 < valm) & (uint)fVar40);
                          pbVar29 = pbVar5;
                          if (0 < lVar35) {
                            pbVar27 = pbVar5;
                            fVar40 = 3.4e+38;
                            do {
                              fVar41 = ((float)*pbVar27 - fVar39) * ((float)*pbVar27 - fVar39);
                              if (fVar41 < fVar40) {
                                pbVar29 = pbVar27;
                              }
                              pbVar27 = pbVar27 + 1;
                              if (fVar40 <= fVar41) {
                                fVar41 = fVar40;
                              }
                              fVar40 = fVar41;
                            } while (pbVar27 < pbVar5 + lVar35);
                          }
                          *pfVar11 = fVar39;
                          fVar39 = (fVar39 - (float)*pbVar29) * fVar44;
                          pfVar11[1] = fVar39 * 7.0 + pfVar11[1];
                          pfVar19[-1] = fVar39 * 3.0 + pfVar19[-1];
                          *pfVar19 = fVar39 * 5.0 + *pfVar19;
                          pfVar19[1] = fVar39 + pfVar19[1];
                          if (map_indexes) {
                            uVar20 = (uint)*pbVar29;
                          }
                          else {
                            uVar20 = (int)pbVar29 - (int)pbVar5;
                          }
                          pfVar11 = pfVar11 + 1;
                          pfVar19 = pfVar19 + 1;
                          *puVar36 = uVar20;
                          puVar36 = puVar36 + 1;
                          iVar6 = iVar6 + 1;
                        } while (iVar6 < (int)this->_width);
                      }
                      iVar30 = iVar30 + 1;
                      uVar20 = this->_height;
                      iVar33 = iVar33 + 1;
                      pfVar11 = local_108;
                      local_108 = pfVar23;
                    } while (iVar30 < (int)uVar20);
                  }
                  lVar12 = lVar12 + 1;
                  lVar37 = lVar37 + 4;
                  local_108 = pfVar23;
                } while (lVar12 < (int)this->_depth);
              }
            }
            else if (0 < (int)uVar20) {
              local_a8 = 0;
              lVar17 = 0;
              do {
                local_b8 = lVar17;
                uVar20 = this->_height;
                pfVar23 = local_108;
                if (0 < (int)uVar20) {
                  local_b0 = this->_data;
                  pbVar5 = local_d8->_data;
                  iVar30 = 0;
                  local_c0 = (float *)CONCAT44(local_c0._4_4_,1);
                  do {
                    pfVar23 = pfVar11;
                    local_c8 = (float *)CONCAT44(local_c8._4_4_,iVar30);
                    if ((iVar30 < (int)(uVar20 - 2)) &&
                       (uVar21 = this->_spectrum, 0 < (long)(int)uVar21)) {
                      uVar3 = this->_width;
                      uVar4 = this->_depth;
                      lVar28 = (ulong)uVar20 * (ulong)uVar3 * local_a8 +
                               (ulong)(uVar3 * (int)local_c0) * 4 + (long)local_b0;
                      lVar17 = 0;
                      pfVar11 = pfVar23;
                      do {
                        if (0 < (int)uVar3) {
                          lVar34 = 0;
                          do {
                            pfVar11[lVar34] = (float)*(uint *)(lVar28 + lVar34 * 4);
                            lVar34 = lVar34 + 1;
                          } while (uVar3 != (uint)lVar34);
                        }
                        lVar17 = lVar17 + 1;
                        lVar28 = lVar28 + (ulong)uVar20 * (ulong)uVar3 * (ulong)uVar4 * 4;
                        pfVar11 = pfVar11 + lVar12;
                      } while (lVar17 != (int)uVar21);
                    }
                    if (0 < (int)this->_width) {
                      iVar33 = 0;
                      pfVar11 = pfVar23;
                      pfVar19 = local_108;
                      do {
                        pbVar29 = pbVar5;
                        if (0 < lVar35) {
                          uVar20 = this->_spectrum;
                          pbVar27 = pbVar5;
                          fVar39 = 3.4e+38;
                          do {
                            fVar40 = 0.0;
                            pbVar16 = pbVar27;
                            pfVar24 = pfVar19;
                            uVar21 = uVar20;
                            if (0 < (int)uVar20) {
                              do {
                                fVar41 = *pfVar24;
                                fVar42 = fVar38;
                                if (fVar41 <= fVar38) {
                                  fVar42 = fVar41;
                                }
                                fVar41 = (float)(-(uint)(fVar41 < valm) & (uint)valm |
                                                ~-(uint)(fVar41 < valm) & (uint)fVar42);
                                *pfVar24 = fVar41;
                                fVar41 = fVar41 - (float)*pbVar16;
                                fVar40 = fVar40 + fVar41 * fVar41;
                                uVar21 = uVar21 - 1;
                                pbVar16 = pbVar16 + lVar35;
                                pfVar24 = pfVar24 + lVar12;
                              } while (uVar21 != 0);
                            }
                            pbVar16 = pbVar27;
                            if (fVar39 <= fVar40) {
                              fVar40 = fVar39;
                              pbVar16 = pbVar29;
                            }
                            pbVar29 = pbVar16;
                            pbVar27 = pbVar27 + 1;
                            fVar39 = fVar40;
                          } while (pbVar27 < pbVar5 + lVar35);
                        }
                        uVar20 = this->_spectrum;
                        if (0 < (int)uVar20) {
                          lVar17 = 4;
                          pbVar27 = pbVar29;
                          do {
                            fVar39 = (*(float *)((long)pfVar19 + lVar17 + -4) - (float)*pbVar27) *
                                     fVar44;
                            *(float *)((long)pfVar19 + lVar17) =
                                 fVar39 * 7.0 + *(float *)((long)pfVar19 + lVar17);
                            *(float *)((long)pfVar11 + lVar17 + -8) =
                                 fVar39 * 3.0 + *(float *)((long)pfVar11 + lVar17 + -8);
                            *(float *)((long)pfVar11 + lVar17 + -4) =
                                 fVar39 * 5.0 + *(float *)((long)pfVar11 + lVar17 + -4);
                            *(float *)((long)pfVar11 + lVar17) =
                                 fVar39 + *(float *)((long)pfVar11 + lVar17);
                            pbVar27 = pbVar27 + lVar35;
                            lVar17 = lVar17 + lVar12 * 4;
                            uVar20 = uVar20 - 1;
                          } while (uVar20 != 0);
                        }
                        if (map_indexes) {
                          if (0 < (int)this->_spectrum) {
                            iVar6 = 0;
                            puVar7 = puVar36;
                            do {
                              *puVar7 = (uint)*pbVar29;
                              pbVar29 = pbVar29 + lVar35;
                              iVar6 = iVar6 + 1;
                              puVar7 = puVar7 + lVar37;
                            } while (iVar6 < (int)this->_spectrum);
                          }
                        }
                        else {
                          local_110._0_4_ = (int)pbVar5;
                          *puVar36 = (int)pbVar29 - (int)local_110;
                        }
                        pfVar19 = pfVar19 + 1;
                        pfVar11 = pfVar11 + 1;
                        puVar36 = puVar36 + 1;
                        iVar33 = iVar33 + 1;
                      } while (iVar33 < (int)this->_width);
                    }
                    iVar30 = iVar30 + 1;
                    uVar20 = this->_height;
                    local_c0 = (float *)CONCAT44(local_c0._4_4_,(int)local_c0 + 1);
                    pfVar11 = local_108;
                    local_108 = pfVar23;
                    local_e0 = pfVar23;
                  } while (iVar30 < (int)uVar20);
                }
                local_a8 = local_a8 + 4;
                lVar17 = local_b8 + 1;
                local_108 = pfVar23;
              } while (local_b8 + 1 < (long)(int)this->_depth);
            }
            if (cache._data == (float *)0x0 || cache._is_shared != false) {
              return local_d0;
            }
            operator_delete__(cache._data);
            return local_d0;
          }
          uVar20 = this->_depth;
          uVar21 = this->_spectrum;
          if (uVar21 == 1) {
            if ((int)uVar20 < 1) {
              return local_d0;
            }
            puVar7 = this->_data;
            lVar37 = 0;
            do {
              uVar10 = (ulong)this->_height;
              if (0 < (int)this->_height) {
                pbVar5 = local_d8->_data;
                lVar12 = 0;
                do {
                  uVar13 = (ulong)this->_width;
                  if (uVar13 != 0) {
                    puVar9 = puVar7 + (ulong)((int)lVar12 * this->_width) +
                                      (uVar10 & 0xffffffff) * lVar37 * uVar13;
                    puVar1 = puVar9 + uVar13;
                    puVar31 = puVar36 + lVar12 * (ulong)local_d0->_width +
                                        (ulong)local_d0->_height * (ulong)local_d0->_width * lVar37;
                    do {
                      pbVar29 = pbVar5;
                      if (0 < lVar35) {
                        fVar38 = 3.4e+38;
                        pbVar27 = pbVar5;
                        do {
                          fVar44 = ((float)*pbVar27 - (float)*puVar9) *
                                   ((float)*pbVar27 - (float)*puVar9);
                          if (fVar44 < fVar38) {
                            pbVar29 = pbVar27;
                          }
                          pbVar27 = pbVar27 + 1;
                          if (fVar38 <= fVar44) {
                            fVar44 = fVar38;
                          }
                          fVar38 = fVar44;
                        } while (pbVar27 < pbVar5 + lVar35);
                      }
                      if (map_indexes) {
                        uVar20 = (uint)*pbVar29;
                      }
                      else {
                        uVar20 = (int)pbVar29 - (int)pbVar5;
                      }
                      puVar9 = puVar9 + 1;
                      *puVar31 = uVar20;
                      puVar31 = puVar31 + 1;
                    } while (puVar9 < puVar1);
                  }
                  lVar12 = lVar12 + 1;
                  uVar10 = (ulong)(int)this->_height;
                } while (lVar12 < (long)uVar10);
              }
              lVar37 = lVar37 + 1;
            } while (lVar37 < (int)this->_depth);
            return local_d0;
          }
          if (uVar21 != 2) {
            if (uVar21 != 3) {
              if ((int)uVar20 < 1) {
                return local_d0;
              }
              puVar7 = this->_data;
              local_110 = 0;
              do {
                uVar10 = (ulong)this->_height;
                if (0 < (int)this->_height) {
                  pbVar5 = local_d8->_data;
                  local_f0 = 0;
                  do {
                    uVar13 = (ulong)this->_width;
                    if (uVar13 != 0) {
                      puVar9 = puVar7 + (ulong)((int)local_f0 * this->_width) +
                                        (uVar10 & 0xffffffff) * local_110 * uVar13;
                      puVar1 = puVar9 + uVar13;
                      puVar31 = puVar36 + local_f0 * (ulong)local_d0->_width +
                                          (ulong)local_d0->_height *
                                          (ulong)local_d0->_width * local_110;
                      do {
                        pbVar29 = pbVar5;
                        if (0 < lVar35) {
                          fVar38 = 3.4e+38;
                          pbVar27 = pbVar5;
                          do {
                            fVar44 = 0.0;
                            pbVar16 = pbVar27;
                            puVar14 = puVar9;
                            uVar20 = this->_spectrum;
                            if (0 < (int)this->_spectrum) {
                              do {
                                fVar44 = fVar44 + ((float)*puVar14 - (float)*pbVar16) *
                                                  ((float)*puVar14 - (float)*pbVar16);
                                uVar20 = uVar20 - 1;
                                pbVar16 = pbVar16 + lVar35;
                                puVar14 = puVar14 + lVar37;
                              } while (uVar20 != 0);
                            }
                            pbVar16 = pbVar27;
                            if (fVar38 <= fVar44) {
                              fVar44 = fVar38;
                              pbVar16 = pbVar29;
                            }
                            pbVar29 = pbVar16;
                            fVar38 = fVar44;
                            pbVar27 = pbVar27 + 1;
                          } while (pbVar27 < pbVar5 + lVar35);
                        }
                        if (map_indexes) {
                          if (0 < (int)this->_spectrum) {
                            iVar30 = 0;
                            puVar14 = puVar31;
                            do {
                              *puVar14 = (uint)*pbVar29;
                              pbVar29 = pbVar29 + lVar35;
                              iVar30 = iVar30 + 1;
                              puVar14 = puVar14 + lVar37;
                            } while (iVar30 < (int)this->_spectrum);
                          }
                        }
                        else {
                          *puVar31 = (int)pbVar29 - (int)pbVar5;
                        }
                        puVar31 = puVar31 + 1;
                        puVar9 = puVar9 + 1;
                      } while (puVar9 < puVar1);
                    }
                    local_f0 = local_f0 + 1;
                    uVar10 = (ulong)(int)this->_height;
                  } while (local_f0 < (long)uVar10);
                }
                local_110 = local_110 + 1;
              } while (local_110 < (int)this->_depth);
              return local_d0;
            }
            if ((int)uVar20 < 1) {
              return local_d0;
            }
            puVar7 = this->_data;
            local_110 = 0;
            do {
              uVar10 = (ulong)this->_height;
              if (0 < (int)this->_height) {
                pbVar5 = local_d8->_data;
                local_f0 = 0;
                do {
                  uVar13 = (ulong)this->_width;
                  if (uVar13 != 0) {
                    puVar9 = puVar7 + (ulong)((int)local_f0 * this->_width) +
                                      (uVar10 & 0xffffffff) * local_110 * uVar13;
                    puVar1 = puVar9 + uVar13;
                    puVar31 = puVar9 + lVar37;
                    puVar14 = puVar31 + lVar37;
                    puVar18 = puVar36 + local_f0 * (ulong)local_d0->_width +
                                        (ulong)local_d0->_height *
                                        (ulong)local_d0->_width * local_110;
                    puVar22 = puVar18 + lVar37;
                    puVar8 = puVar22 + lVar37;
                    do {
                      pbVar29 = pbVar5;
                      if (0 < lVar35) {
                        pbVar27 = pbVar5;
                        fVar38 = 3.4e+38;
                        do {
                          fVar44 = ((float)pbVar27[lVar35 * 2] - (float)*puVar14) *
                                   ((float)pbVar27[lVar35 * 2] - (float)*puVar14) +
                                   ((float)*pbVar27 - (float)*puVar9) *
                                   ((float)*pbVar27 - (float)*puVar9) +
                                   ((float)pbVar27[lVar35] - (float)*puVar31) *
                                   ((float)pbVar27[lVar35] - (float)*puVar31);
                          if (fVar44 < fVar38) {
                            pbVar29 = pbVar27;
                          }
                          pbVar27 = pbVar27 + 1;
                          if (fVar38 <= fVar44) {
                            fVar44 = fVar38;
                          }
                          fVar38 = fVar44;
                        } while (pbVar27 < pbVar5 + lVar35);
                      }
                      if (map_indexes) {
                        *puVar18 = (uint)*pbVar29;
                        *puVar22 = (uint)pbVar29[lVar35];
                        puVar22 = puVar22 + 1;
                        *puVar8 = (uint)pbVar29[lVar35 * 2];
                        puVar8 = puVar8 + 1;
                      }
                      else {
                        *puVar18 = (int)pbVar29 - (int)pbVar5;
                      }
                      puVar9 = puVar9 + 1;
                      puVar31 = puVar31 + 1;
                      puVar14 = puVar14 + 1;
                      puVar18 = puVar18 + 1;
                    } while (puVar9 < puVar1);
                  }
                  local_f0 = local_f0 + 1;
                  uVar10 = (ulong)(int)this->_height;
                } while (local_f0 < (long)uVar10);
              }
              local_110 = local_110 + 1;
            } while (local_110 < (int)this->_depth);
            return local_d0;
          }
          if ((int)uVar20 < 1) {
            return local_d0;
          }
          puVar7 = this->_data;
          lVar12 = 0;
          do {
            uVar10 = (ulong)this->_height;
            if (0 < (int)this->_height) {
              pbVar5 = local_d8->_data;
              lVar17 = 0;
              do {
                uVar13 = (ulong)this->_width;
                if (uVar13 != 0) {
                  puVar9 = puVar7 + (ulong)((int)lVar17 * this->_width) +
                                    (uVar10 & 0xffffffff) * lVar12 * uVar13;
                  puVar1 = puVar9 + uVar13;
                  puVar31 = puVar9 + lVar37;
                  puVar14 = puVar36 + lVar17 * (ulong)local_d0->_width +
                                      (ulong)local_d0->_height * (ulong)local_d0->_width * lVar12;
                  puVar18 = puVar14 + lVar37;
                  do {
                    pbVar29 = pbVar5;
                    if (0 < lVar35) {
                      fVar38 = 3.4e+38;
                      pbVar27 = pbVar5;
                      do {
                        fVar44 = ((float)*pbVar27 - (float)*puVar9) *
                                 ((float)*pbVar27 - (float)*puVar9) +
                                 ((float)pbVar27[lVar35] - (float)*puVar31) *
                                 ((float)pbVar27[lVar35] - (float)*puVar31);
                        if (fVar44 < fVar38) {
                          pbVar29 = pbVar27;
                        }
                        pbVar27 = pbVar27 + 1;
                        if (fVar38 <= fVar44) {
                          fVar44 = fVar38;
                        }
                        fVar38 = fVar44;
                      } while (pbVar27 < pbVar5 + lVar35);
                    }
                    if (map_indexes) {
                      *puVar14 = (uint)*pbVar29;
                      *puVar18 = (uint)pbVar29[lVar35];
                      puVar18 = puVar18 + 1;
                    }
                    else {
                      *puVar14 = (int)pbVar29 - (int)pbVar5;
                    }
                    puVar9 = puVar9 + 1;
                    puVar31 = puVar31 + 1;
                    puVar14 = puVar14 + 1;
                  } while (puVar9 < puVar1);
                }
                lVar17 = lVar17 + 1;
                uVar10 = (ulong)(int)this->_height;
              } while (lVar17 < (long)uVar10);
            }
            lVar12 = lVar12 + 1;
          } while (lVar12 < (int)this->_depth);
          return local_d0;
        }
      }
    }
  }
  __return_storage_ptr__->_data = (uint *)0x0;
  __return_storage_ptr__->_width = 0;
  __return_storage_ptr__->_height = 0;
  __return_storage_ptr__->_depth = 0;
  __return_storage_ptr__->_spectrum = 0;
  __return_storage_ptr__->_is_shared = false;
  return __return_storage_ptr__;
}

Assistant:

CImg<typename CImg<t>::Tuint>
    get_index(const CImg<t>& colormap, const float dithering=1, const bool map_indexes=true) const {
      if (colormap._spectrum!=_spectrum)
        throw CImgArgumentException(_cimg_instance
                                    "index(): Instance and specified colormap (%u,%u,%u,%u,%p) "
                                    "have incompatible dimensions.",
                                    cimg_instance,
                                    colormap._width,colormap._height,colormap._depth,colormap._spectrum,colormap._data);

      typedef typename CImg<t>::Tuint tuint;
      if (is_empty()) return CImg<tuint>();
      const unsigned long whd = (unsigned long)_width*_height*_depth, pwhd = (unsigned long)colormap._width*colormap._height*colormap._depth;
      CImg<tuint> res(_width,_height,_depth,map_indexes?_spectrum:1);
      tuint *ptrd = res._data;
      if (dithering>0) { // Dithered versions.
        const float ndithering = (dithering<0?0:dithering>1?1:dithering)/16;
        Tfloat valm = 0, valM = (Tfloat)max_min(valm);
        if (valm==valM && valm>=0 && valM<=255) { valm = 0; valM = 255; }
        CImg<Tfloat> cache = get_crop(-1,0,0,0,_width,1,0,_spectrum-1);
        Tfloat *cache_current = cache.data(1,0,0,0), *cache_next = cache.data(1,1,0,0);
        const unsigned long cwhd = (unsigned long)cache._width*cache._height*cache._depth;
        switch (_spectrum) {
        case 1 : { // Optimized for scalars.
          cimg_forYZ(*this,y,z) {
            if (y<height()-2) {
              Tfloat *ptrc0 = cache_next; const T *ptrs0 = data(0,y+1,z,0);
              cimg_forX(*this,x) *(ptrc0++) = (Tfloat)*(ptrs0++);
            }
            Tfloat *ptrs0 = cache_current, *ptrsn0 = cache_next;
            cimg_forX(*this,x) {
              const Tfloat _val0 = (Tfloat)*ptrs0, val0 = _val0<valm?valm:_val0>valM?valM:_val0;
              Tfloat distmin = cimg::type<Tfloat>::max(); const t *ptrmin0 = colormap._data;
              for (const t *ptrp0 = colormap._data, *ptrp_end = ptrp0 + pwhd; ptrp0<ptrp_end; ) {
                const Tfloat pval0 = (Tfloat)*(ptrp0++) - val0, dist = pval0*pval0;
                if (dist<distmin) { ptrmin0 = ptrp0 - 1; distmin = dist; }
              }
              const Tfloat err0 = ((*(ptrs0++)=val0) - (Tfloat)*ptrmin0)*ndithering;
              *ptrs0+=7*err0; *(ptrsn0-1)+=3*err0; *(ptrsn0++)+=5*err0; *ptrsn0+=err0;
              if (map_indexes) *(ptrd++) = (tuint)*ptrmin0; else *(ptrd++) = (tuint)(ptrmin0 - colormap._data);
            }
            cimg::swap(cache_current,cache_next);
          }
        } break;
        case 2 : { // Optimized for 2d vectors.
          tuint *ptrd1 = ptrd + whd;
          cimg_forYZ(*this,y,z) {
            if (y<height()-2) {
              Tfloat *ptrc0 = cache_next, *ptrc1 = ptrc0 + cwhd;
              const T *ptrs0 = data(0,y+1,z,0), *ptrs1 = ptrs0 + whd;
              cimg_forX(*this,x) { *(ptrc0++) = (Tfloat)*(ptrs0++); *(ptrc1++) = (Tfloat)*(ptrs1++); }
            }
            Tfloat
              *ptrs0 = cache_current, *ptrs1 = ptrs0 + cwhd,
              *ptrsn0 = cache_next, *ptrsn1 = ptrsn0 + cwhd;
            cimg_forX(*this,x) {
              const Tfloat
                _val0 = (Tfloat)*ptrs0, val0 = _val0<valm?valm:_val0>valM?valM:_val0,
                _val1 = (Tfloat)*ptrs1, val1 = _val1<valm?valm:_val1>valM?valM:_val1;
              Tfloat distmin = cimg::type<Tfloat>::max(); const t *ptrmin0 = colormap._data;
              for (const t *ptrp0 = colormap._data, *ptrp1 = ptrp0 + pwhd, *ptrp_end = ptrp1; ptrp0<ptrp_end; ) {
                const Tfloat
                  pval0 = (Tfloat)*(ptrp0++) - val0, pval1 = (Tfloat)*(ptrp1++) - val1,
                  dist = pval0*pval0 + pval1*pval1;
                if (dist<distmin) { ptrmin0 = ptrp0 - 1; distmin = dist; }
              }
              const t *const ptrmin1 = ptrmin0 + pwhd;
              const Tfloat
                err0 = ((*(ptrs0++)=val0) - (Tfloat)*ptrmin0)*ndithering,
                err1 = ((*(ptrs1++)=val1) - (Tfloat)*ptrmin1)*ndithering;
              *ptrs0+=7*err0; *ptrs1+=7*err1;
              *(ptrsn0-1)+=3*err0; *(ptrsn1-1)+=3*err1;
              *(ptrsn0++)+=5*err0; *(ptrsn1++)+=5*err1;
              *ptrsn0+=err0; *ptrsn1+=err1;
              if (map_indexes) { *(ptrd++) = (tuint)*ptrmin0; *(ptrd1++) = (tuint)*ptrmin1; }
              else *(ptrd++) = (tuint)(ptrmin0 - colormap._data);
            }
            cimg::swap(cache_current,cache_next);
          }
        } break;
        case 3 : { // Optimized for 3d vectors (colors).
          tuint *ptrd1 = ptrd + whd, *ptrd2 = ptrd1 + whd;
          cimg_forYZ(*this,y,z) {
            if (y<height()-2) {
              Tfloat *ptrc0 = cache_next, *ptrc1 = ptrc0 + cwhd, *ptrc2 = ptrc1 + cwhd;
              const T *ptrs0 = data(0,y+1,z,0), *ptrs1 = ptrs0 + whd, *ptrs2 = ptrs1 + whd;
              cimg_forX(*this,x) { *(ptrc0++) = (Tfloat)*(ptrs0++); *(ptrc1++) = (Tfloat)*(ptrs1++); *(ptrc2++) = (Tfloat)*(ptrs2++); }
            }
            Tfloat
              *ptrs0 = cache_current, *ptrs1 = ptrs0 + cwhd, *ptrs2 = ptrs1 + cwhd,
              *ptrsn0 = cache_next, *ptrsn1 = ptrsn0 + cwhd, *ptrsn2 = ptrsn1 + cwhd;
            cimg_forX(*this,x) {
              const Tfloat
                _val0 = (Tfloat)*ptrs0, val0 = _val0<valm?valm:_val0>valM?valM:_val0,
                _val1 = (Tfloat)*ptrs1, val1 = _val1<valm?valm:_val1>valM?valM:_val1,
                _val2 = (Tfloat)*ptrs2, val2 = _val2<valm?valm:_val2>valM?valM:_val2;
              Tfloat distmin = cimg::type<Tfloat>::max(); const t *ptrmin0 = colormap._data;
              for (const t *ptrp0 = colormap._data, *ptrp1 = ptrp0 + pwhd, *ptrp2 = ptrp1 + pwhd, *ptrp_end = ptrp1; ptrp0<ptrp_end; ) {
                const Tfloat
                  pval0 = (Tfloat)*(ptrp0++) - val0, pval1 = (Tfloat)*(ptrp1++) - val1, pval2 = (Tfloat)*(ptrp2++) - val2,
                  dist = pval0*pval0 + pval1*pval1 + pval2*pval2;
                if (dist<distmin) { ptrmin0 = ptrp0 - 1; distmin = dist; }
              }
              const t *const ptrmin1 = ptrmin0 + pwhd, *const ptrmin2 = ptrmin1 + pwhd;
              const Tfloat
                err0 = ((*(ptrs0++)=val0) - (Tfloat)*ptrmin0)*ndithering,
                err1 = ((*(ptrs1++)=val1) - (Tfloat)*ptrmin1)*ndithering,
                err2 = ((*(ptrs2++)=val2) - (Tfloat)*ptrmin2)*ndithering;

              *ptrs0+=7*err0; *ptrs1+=7*err1; *ptrs2+=7*err2;
              *(ptrsn0-1)+=3*err0; *(ptrsn1-1)+=3*err1; *(ptrsn2-1)+=3*err2;
              *(ptrsn0++)+=5*err0; *(ptrsn1++)+=5*err1; *(ptrsn2++)+=5*err2;
              *ptrsn0+=err0; *ptrsn1+=err1; *ptrsn2+=err2;

              if (map_indexes) { *(ptrd++) = (tuint)*ptrmin0; *(ptrd1++) = (tuint)*ptrmin1; *(ptrd2++) = (tuint)*ptrmin2; }
              else *(ptrd++) = (tuint)(ptrmin0 - colormap._data);
            }
            cimg::swap(cache_current,cache_next);
          }
        } break;
        default : // Generic version
          cimg_forYZ(*this,y,z) {
            if (y<height()-2) {
              Tfloat *ptrc = cache_next;
              cimg_forC(*this,c) {
                Tfloat *_ptrc = ptrc; const T *_ptrs = data(0,y+1,z,c);
                cimg_forX(*this,x) *(_ptrc++) = (Tfloat)*(_ptrs++);
                ptrc+=cwhd;
              }
            }
            Tfloat *ptrs = cache_current, *ptrsn = cache_next;
            cimg_forX(*this,x) {
              Tfloat distmin = cimg::type<Tfloat>::max(); const t *ptrmin = colormap._data;
              for (const t *ptrp = colormap._data, *ptrp_end = ptrp + pwhd; ptrp<ptrp_end; ++ptrp) {
                Tfloat dist = 0; Tfloat *_ptrs = ptrs; const t *_ptrp = ptrp;
                cimg_forC(*this,c) {
                  const Tfloat _val = *_ptrs, val = _val<valm?valm:_val>valM?valM:_val;
                  dist+=cimg::sqr((*_ptrs=val) - (Tfloat)*_ptrp); _ptrs+=cwhd; _ptrp+=pwhd;
                }
                if (dist<distmin) { ptrmin = ptrp; distmin = dist; }
              }
              const t *_ptrmin = ptrmin; Tfloat *_ptrs = ptrs++, *_ptrsn = (ptrsn++)-1;
              cimg_forC(*this,c) {
                const Tfloat err = (*(_ptrs++) - (Tfloat)*_ptrmin)*ndithering;
                *_ptrs+=7*err; *(_ptrsn++)+=3*err; *(_ptrsn++)+=5*err; *_ptrsn+=err;
                _ptrmin+=pwhd; _ptrs+=cwhd-1; _ptrsn+=cwhd-2;
              }
              if (map_indexes) {
                tuint *_ptrd = ptrd++;
                cimg_forC(*this,c) { *_ptrd = (tuint)*ptrmin; _ptrd+=whd; ptrmin+=pwhd; }
              }
              else *(ptrd++) = (tuint)(ptrmin - colormap._data);
            }
            cimg::swap(cache_current,cache_next);
          }
        }